

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.cpp
# Opt level: O0

string * booster::stack_trace::get_symbol_abi_cxx11_(void *ptr)

{
  int iVar1;
  ostream *poVar2;
  char *__ptr;
  void *in_RSI;
  string *in_RDI;
  uint offset;
  char *demangled;
  int status;
  Dl_info info;
  ostringstream res;
  undefined4 local_1c4;
  char *local_1c0 [2];
  char *local_1b0;
  int local_1a8;
  locale local_190;
  ostringstream local_188 [376];
  void *local_10;
  
  if (in_RSI == (void *)0x0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    local_10 = in_RSI;
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::locale::classic();
    std::ios::imbue(&local_190);
    std::locale::~locale(&local_190);
    poVar2 = (ostream *)std::ostream::operator<<(local_188,local_10);
    std::operator<<(poVar2,": ");
    memset(local_1c0,0,0x20);
    iVar1 = dladdr(local_10,local_1c0);
    if (iVar1 == 0) {
      std::operator<<((ostream *)local_188,"???");
    }
    else {
      if (local_1b0 == (char *)0x0) {
        std::operator<<((ostream *)local_188,"???");
      }
      else {
        local_1c4 = 0;
        __ptr = (char *)__cxa_demangle(local_1b0,0,0,&local_1c4);
        if (__ptr == (char *)0x0) {
          std::operator<<((ostream *)local_188,local_1b0);
        }
        else {
          std::operator<<((ostream *)local_188,__ptr);
          free(__ptr);
        }
      }
      poVar2 = (ostream *)std::ostream::operator<<(local_188,std::hex);
      poVar2 = std::operator<<(poVar2," + 0x");
      std::ostream::operator<<(poVar2,(int)local_10 - local_1a8);
      if (local_1c0[0] != (char *)0x0) {
        poVar2 = std::operator<<((ostream *)local_188," in ");
        std::operator<<(poVar2,local_1c0[0]);
      }
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return in_RDI;
}

Assistant:

std::string get_symbol(void *ptr)
        {
            if(!ptr)
                return std::string();
            std::ostringstream res;
            res.imbue(std::locale::classic());
            res << ptr<<": ";
            Dl_info info = Dl_info();
            if(dladdr(ptr,&info) == 0) {
                res << "???";
            }
            else {
                if(info.dli_sname) {
                    int status = 0;
                    char *demangled = abi::__cxa_demangle(info.dli_sname,0,0,&status);
                    if(demangled) {
                        res << demangled;
                        free(demangled);
                    }
                    else {
                        res << info.dli_sname;
                    }
                }
                else {
                    res << "???";
                }

                unsigned offset = (char *)ptr - (char *)info.dli_saddr;
                res << std::hex <<" + 0x" << offset ;

                if(info.dli_fname)
                    res << " in " << info.dli_fname;
            }
           return res.str();
        }